

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O3

void __thiscall mdsplit::mdsplitter::list_doc_outsiders(mdsplitter *this)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  long lVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  path *ppVar9;
  size_t sVar10;
  istream *piVar11;
  ostream *poVar12;
  pointer pmVar13;
  pointer ppVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  pointer pmVar18;
  pointer this_00;
  long lVar19;
  undefined1 auVar20 [16];
  string current_line;
  regex gen_with_mdsplit_regex;
  regex ignore_begin_regex;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> outsiders;
  regex ignore_end_regex;
  smatch sm;
  path outsider;
  undefined1 local_358 [40];
  mdsplitter *local_330;
  path *local_328;
  string local_320;
  pointer local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  recursive_directory_iterator local_2b8;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_2a8;
  undefined1 local_288 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_268;
  recursive_directory_iterator local_248;
  path local_238 [13];
  
  local_2a8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_2a8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_2a8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)local_2f8,&this->output_dir_,none,(error_code *)0x0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_2d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_2d8._8_8_ = local_2f8._8_8_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_2f8._8_8_ + 8) = *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_2f8._8_8_ + 8) = *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
    }
  }
  local_2b8._M_dirs._M_ptr = (element_type *)0x0;
  local_2b8._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_2b8);
  local_248._M_dirs._M_ptr = (element_type *)local_2f8._0_8_;
  local_248._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_2f8._8_8_ + 8) = *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_2f8._8_8_ + 8) = *(_Atomic_word *)(local_2f8._8_8_ + 8) + 1;
    }
  }
  local_288 = (undefined1  [8])0x0;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar8 = std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                    (&local_248);
  local_328 = (path *)CONCAT44(local_328._4_4_,(int)CONCAT71((int7)((ulong)uVar8 >> 8),1));
  local_330 = this;
  do {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ == _Stack_280._M_pi) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_288);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_2d8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)local_2f8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2f8,
                 " *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *",
                 0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2d8,
                 " *<!-- START mdsplit-ignore --> *",0x10);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_288,
                 " *<!-- END mdsplit-ignore --> *",0x10);
      local_300 = (pointer)local_2a8.
                           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2a8.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2a8.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar14 = local_2a8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar1 = (ppVar14->_M_pathname)._M_dataplus._M_p;
          local_358._0_8_ = local_358 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,pcVar1,pcVar1 + (ppVar14->_M_pathname)._M_string_length);
          std::ifstream::ifstream(local_238,(string *)local_358,_S_in);
          local_328 = ppVar14;
          if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
            operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
          }
          local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
          local_320._M_string_length = 0;
          local_320.field_2._M_local_buf[0] = '\0';
          bVar15 = 0;
          bVar4 = false;
          do {
            cVar5 = std::ios::widen((char)*(undefined8 *)
                                           (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                    (char)local_238);
            piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_320,cVar5);
            if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
            local_268.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_268._M_begin._M_current = (char *)0x0;
            local_268.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_268.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            bVar6 = is_codeblock(&local_320);
            bVar15 = bVar15 ^ bVar6;
            if (bVar15 == 0) {
              local_358._16_8_ = (pointer)0x0;
              local_358._24_8_ = (char *)0x0;
              local_358._0_8_ = (pointer)0x0;
              local_358._8_8_ = (pointer)0x0;
              bVar6 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_320._M_dataplus._M_p,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(local_320._M_dataplus._M_p + local_320._M_string_length),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)local_358,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2d8,0
                                );
              if ((pointer)local_358._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
              }
              if (bVar6) {
                bVar4 = true;
              }
              else {
                local_358._16_8_ = (pointer)0x0;
                local_358._24_8_ = (char *)0x0;
                local_358._0_8_ = (pointer)0x0;
                local_358._8_8_ = (pointer)0x0;
                bVar6 = std::__detail::
                        __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_320._M_dataplus._M_p,
                                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(local_320._M_dataplus._M_p + local_320._M_string_length),
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)local_358,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_288
                                   ,0);
                if ((pointer)local_358._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
                }
                if (!bVar6 && !bVar4) {
                  bVar4 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_320._M_dataplus._M_p,
                                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(local_320._M_dataplus._M_p + local_320._M_string_length),
                                     &local_268,
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_2f8,0);
                  if (bVar4) {
                    if (local_330->trace_ == true) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Outsider doc file generated by mdsplit: ",
                                 0x28);
                      pcVar1 = (local_328->_M_pathname)._M_dataplus._M_p;
                      local_358._0_8_ = local_358 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_358,pcVar1,
                                 pcVar1 + (local_328->_M_pathname)._M_string_length);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_358._0_8_,
                                           local_358._8_8_);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) +
                                      (char)poVar12);
                      std::ostream::put((char)poVar12);
                      std::ostream::flush();
                      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
                        operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
                      }
                    }
                    bVar6 = true;
                    if (local_330->erase_old_mdsplit_files_ == true) {
                      if (local_330->trace_ == true) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Removing ",9);
                        pcVar1 = (local_328->_M_pathname)._M_dataplus._M_p;
                        local_358._0_8_ = local_358 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_358,pcVar1,
                                   pcVar1 + (local_328->_M_pathname)._M_string_length);
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,(char *)local_358._0_8_,
                                             local_358._8_8_);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) +
                                        (char)poVar12);
                        std::ostream::put((char)poVar12);
                        std::ostream::flush();
                        if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
                          operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
                        }
                      }
                      std::filesystem::remove(local_328);
                    }
                  }
                  else {
                    bVar6 = false;
                  }
                  bVar4 = false;
                  goto LAB_00129797;
                }
                bVar4 = (bool)(bVar4 & !bVar6);
              }
              bVar6 = false;
            }
            else {
              bVar6 = false;
            }
LAB_00129797:
            if (local_268.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_268.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_268.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_268.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          } while (!bVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p,
                            CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                                     local_320.field_2._M_local_buf[0]) + 1);
          }
          std::ifstream::~ifstream(local_238);
          ppVar14 = local_328 + 1;
        } while ((pointer)ppVar14 != local_300);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_288);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2d8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_2f8);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector(&local_2a8);
      return;
    }
    ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)local_2d8);
    auVar20 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar20._8_8_ == -1 || auVar20._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(local_238);
    }
    else {
      std::__cxx11::string::substr((ulong)local_358,auVar20._0_8_);
      std::filesystem::__cxx11::path::path(local_238,(string_type *)local_358,auto_format);
      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
        operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
      }
    }
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              ((path *)local_358,(char (*) [4])0x12f238,auto_format);
    iVar7 = std::filesystem::__cxx11::path::compare(local_238);
    std::filesystem::__cxx11::path::~path((path *)local_358);
    std::filesystem::__cxx11::path::~path(local_238);
    if (iVar7 == 0) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::relative(local_238,ppVar9);
      std::filesystem::__cxx11::path::~path((path *)local_358);
      pmVar13 = (this->sections_).
                super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
                super__Vector_impl_data._M_start;
      pmVar18 = (this->sections_).
                super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar16 = (long)pmVar18 - (long)pmVar13;
      if (0 < lVar16 >> 9) {
        lVar17 = (lVar16 >> 9) + 1;
        lVar3 = 0;
        local_300 = pmVar18;
        do {
          lVar19 = lVar3;
          iVar7 = std::filesystem::__cxx11::path::compare
                            ((path *)((long)&(pmVar13->filepath)._M_pathname._M_dataplus._M_p +
                                     lVar19));
          if (iVar7 == 0) {
            this_00 = (mdsection *)((long)&pmVar13->level + lVar19);
            this = local_330;
            goto LAB_00129229;
          }
          iVar7 = std::filesystem::__cxx11::path::compare
                            ((path *)((long)&pmVar13[1].filepath._M_pathname._M_dataplus._M_p +
                                     lVar19));
          if (iVar7 == 0) {
            this_00 = (mdsection *)((long)&pmVar13[1].level + lVar19);
            this = local_330;
            goto LAB_00129229;
          }
          iVar7 = std::filesystem::__cxx11::path::compare
                            ((path *)((long)&pmVar13[2].filepath._M_pathname._M_dataplus._M_p +
                                     lVar19));
          if (iVar7 == 0) {
            this_00 = (mdsection *)((long)&pmVar13[2].level + lVar19);
            this = local_330;
            goto LAB_00129229;
          }
          iVar7 = std::filesystem::__cxx11::path::compare
                            ((path *)((long)&pmVar13[3].filepath._M_pathname._M_dataplus._M_p +
                                     lVar19));
          if (iVar7 == 0) {
            this_00 = (mdsection *)((long)&pmVar13[3].level + lVar19);
            this = local_330;
            goto LAB_00129229;
          }
          lVar17 = lVar17 + -1;
          lVar3 = lVar19 + 0x200;
        } while (1 < lVar17);
        lVar16 = lVar16 - (lVar19 + 0x200);
        pmVar13 = (pointer)((long)&pmVar13[4].level + lVar19);
        pmVar18 = local_300;
      }
      lVar16 = lVar16 >> 7;
      this = local_330;
      if (lVar16 == 1) {
LAB_001291fa:
        iVar7 = std::filesystem::__cxx11::path::compare(&pmVar13->filepath);
        this_00 = pmVar18;
        if (iVar7 == 0) {
          this_00 = pmVar13;
        }
      }
      else if (lVar16 == 2) {
LAB_001291cd:
        this = local_330;
        iVar7 = std::filesystem::__cxx11::path::compare(&pmVar13->filepath);
        this_00 = pmVar13;
        if (iVar7 != 0) {
          pmVar13 = pmVar13 + 1;
          goto LAB_001291fa;
        }
      }
      else {
        this_00 = pmVar18;
        if ((lVar16 == 3) &&
           (iVar7 = std::filesystem::__cxx11::path::compare(&pmVar13->filepath), this_00 = pmVar13,
           this = local_330, iVar7 != 0)) {
          pmVar13 = pmVar13 + 1;
          goto LAB_001291cd;
        }
      }
LAB_00129229:
      if ((this_00 ==
           (this->sections_).
           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (bVar4 = mdsection::has_content(this_00,false,false), !bVar4)) {
        bVar15 = this->trace_;
        if ((((ulong)local_328 & 1) != 0) && ((bVar15 & 1) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "\n# The following .md files were not generated by mdsplit in this run",0x44);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Please make sure that is on purpose:",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
          bVar15 = this->trace_;
        }
        if ((bVar15 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Outsider doc file: ",0x13);
          _Var2._M_p = local_238[0]._M_pathname._M_dataplus._M_p;
          if (local_238[0]._M_pathname._M_dataplus._M_p == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1422b0);
          }
          else {
            sVar10 = strlen(local_238[0]._M_pathname._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,_Var2._M_p,sVar10);
          }
          local_358[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_358,1);
        }
        std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
        emplace_back<std::filesystem::__cxx11::path&>
                  ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                    *)&local_2a8,local_238);
        local_328 = (path *)((ulong)local_328 & 0xffffffff00000000);
      }
      std::filesystem::__cxx11::path::~path(local_238);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_2d8);
  } while( true );
}

Assistant:

void mdsplitter::list_doc_outsiders() {
        bool first = true;
        std::vector<fs::path> outsiders;
        for (auto &p : fs::recursive_directory_iterator(output_dir_)) {
            if (p.path().extension() == ".md") {
                fs::path outsider = fs::relative(p.path(), fs::current_path());
                auto it = std::find_if(
                    sections_.begin(), sections_.end(),
                    [&](const mdsection &s) { return s.filepath == outsider; });
                bool section_exists = it != sections_.end();
                if (!section_exists || !it->has_content()) {
                    if (first) {
                        if (trace_) {
                            std::cout << "\n# The following .md files were not "
                                         "generated by mdsplit in this run"
                                      << std::endl;
                            std::cout
                                << "# Please make sure that is on purpose:"
                                << std::endl;
                        }
                        first = false;
                    }
                    if (trace_) {
                        std::cout << "Outsider doc file: " << outsider.c_str()
                                  << '\n';
                    }
                    outsiders.emplace_back(outsider);
                }
            }
        }

        // Remove outsiders generated by mdsplit
        std::regex gen_with_mdsplit_regex{
            R"( *<!-- Generated with mdsplit: https://github.com/alandefreitas/mdsplit --> *)"};
        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        for (const auto &outsider : outsiders) {
            std::ifstream fin(outsider.string());
            std::string current_line;
            bool inside_codeblock = false;
            bool inside_ignoreblock = false;
            while (std::getline(fin, current_line)) {
                std::smatch sm;
                if (is_codeblock(current_line)) {
                    inside_codeblock = 1 - inside_codeblock;
                }
                if (!inside_codeblock) {
                    if (std::regex_match(current_line, ignore_begin_regex)) {
                        inside_ignoreblock = true;
                        continue;
                    } else if (std::regex_match(current_line,
                                                ignore_end_regex)) {
                        inside_ignoreblock = false;
                        continue;
                    }
                    if (inside_ignoreblock) {
                        continue;
                    }

                    bool is_mdsplit_file = std::regex_search(
                        current_line, sm, gen_with_mdsplit_regex);
                    if (is_mdsplit_file) {
                        if (trace_) {
                            std::cout
                                << "Outsider doc file generated by mdsplit: "
                                << outsider.string() << std::endl;
                        }
                        if (erase_old_mdsplit_files_) {
                            if (trace_) {
                                std::cout << "Removing " << outsider.string()
                                          << std::endl;
                            }
                            fs::remove(outsider);
                        }
                        break;
                    }
                }
            }
        }
    }